

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

void __thiscall
Disa::Vector_Dense<double,_3UL>::Vector_Dense
          (Vector_Dense<double,_3UL> *this,function<double_(unsigned_long)> *lambda,size_t size)

{
  ostream *poVar1;
  source_location *in_RCX;
  size_type i_element;
  unsigned_long __args;
  double dVar2;
  undefined **local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (size == 3) {
    for (__args = 0; __args != 3; __args = __args + 1) {
      dVar2 = std::function<double_(unsigned_long)>::operator()(lambda,__args);
      (this->super_array<double,_3UL>)._M_elems[__args] = dVar2;
    }
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_40 = &PTR_s__workspace_llm4binary_github_lic_00172508;
  console_format_abi_cxx11_(&local_38,(Disa *)0x0,(Log_Level)&local_40,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)&local_38);
  poVar1 = std::operator<<(poVar1,"Cannot change the size for a static vector.");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_38);
  exit(1);
}

Assistant:

explicit Vector_Dense(const std::function<_type(const std::size_t)>& lambda, std::size_t size = _size) {
    ASSERT_DEBUG(size == _size, "Cannot change the size for a static vector.");
    FOR(i_element, this->size())(*this)[i_element] = lambda(i_element);
  }